

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

char * deqp::gles31::Functional::getTextureTypeName(TextureType type)

{
  char *pcStack_10;
  TextureType type_local;
  
  switch(type) {
  case TEXTURETYPE_2D:
    pcStack_10 = "2d";
    break;
  case TEXTURETYPE_CUBE:
    pcStack_10 = "cube";
    break;
  case TEXTURETYPE_2D_ARRAY:
    pcStack_10 = "2d_array";
    break;
  case TEXTURETYPE_3D:
    pcStack_10 = "3d";
    break;
  default:
    pcStack_10 = (char *)0x0;
    break;
  case TEXTURETYPE_BUFFER:
    pcStack_10 = "buffer";
  }
  return pcStack_10;
}

Assistant:

static const char* getTextureTypeName (TextureType type)
{
	switch (type)
	{
		case TEXTURETYPE_BUFFER:	return "buffer";
		case TEXTURETYPE_2D:		return "2d";
		case TEXTURETYPE_CUBE:		return "cube";
		case TEXTURETYPE_3D:		return "3d";
		case TEXTURETYPE_2D_ARRAY:	return "2d_array";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}